

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O0

void __thiscall helics::ipc::IpcComms::loadNetworkInfo(IpcComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  CommsInterface *unaff_retaddr;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  CommsInterface::loadNetworkInfo(unaff_retaddr,(NetworkBrokerData *)in_RDI);
  bVar1 = CommsInterface::propertyLock(this_00);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3bd450);
    if (bVar1) {
      if ((in_RDI->serverMode & 1U) == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                  (char *)in_RDI);
      }
    }
    CommsInterface::propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void IpcComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
    {
        CommsInterface::loadNetworkInfo(netInfo);
        if (!propertyLock()) {
            return;
        }
        // brokerPort = netInfo.brokerPort;
        // PortNumber = netInfo.portNumber;
        if (localTargetAddress.empty()) {
            if (serverMode) {
                localTargetAddress = "_ipc_broker";
            } else {
                localTargetAddress = name;
            }
        }

        // if (PortNumber > 0)
        //{
        //    autoPortNumber = false;
        //}
        propertyUnLock();
    }